

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void Fl_Text_Display::buffer_predelete_cb(int pos,int nDeleted,void *cbArg)

{
  Fl_Text_Display *textD;
  
  if (*(int *)((long)cbArg + 0xe8) != 0) {
    measure_deleted_lines((Fl_Text_Display *)cbArg,pos,nDeleted);
    return;
  }
  *(undefined4 *)((long)cbArg + 0x13c) = 0;
  return;
}

Assistant:

void Fl_Text_Display::buffer_predelete_cb(int pos, int nDeleted, void *cbArg) {
  Fl_Text_Display *textD = (Fl_Text_Display *)cbArg;
  if (textD->mContinuousWrap) {
  /* Note: we must perform this measurement, even if there is not a
   single character deleted; the number of "deleted" lines is the
   number of visual lines spanned by the real line in which the
   modification takes place.
   Also, a modification of the tab distance requires the same
   kind of calculations in advance, even if the font width is "fixed",
   because when the width of the tab characters changes, the layout
   of the text may be completely different. */
    IS_UTF8_ALIGNED2(textD->buffer(), pos)
    textD->measure_deleted_lines(pos, nDeleted);
  } else {
    textD->mSuppressResync = 0; /* Probably not needed, but just in case */
  }
}